

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finite.h
# Opt level: O2

void __thiscall Finite::Finite(Finite *this,BigInteger *n)

{
  bool bVar1;
  BigInteger BStack_128;
  BigInteger local_108;
  BigInteger local_e8;
  BigInteger local_c8;
  BigInteger local_a8;
  BigInteger local_88;
  BigInteger local_68;
  BigInteger local_48;
  
  BigInteger::BigInteger(&this->val,n);
  bVar1 = operator>=(&this->val,&_FINITE_ORDER);
  if (bVar1) {
    BigInteger::operator%=(&this->val,&_FINITE_ORDER);
  }
  BigInteger::BigInteger(&local_108,0);
  bVar1 = ::operator<(&this->val,&local_108);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
  if (bVar1) {
    BigInteger::BigInteger(&local_a8,0);
    ::operator-(&local_88,&local_a8,&this->val);
    BigInteger::BigInteger(&local_c8,1);
    ::operator-(&local_68,&local_88,&local_c8);
    operator%(&BStack_128,&local_68,&_FINITE_ORDER);
    BigInteger::BigInteger(&local_e8,1);
    ::operator+(&local_48,&BStack_128,&local_e8);
    ::operator-(&local_108,&_FINITE_ORDER,&local_48);
    BigInteger::operator=(&this->val,&local_108);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&BStack_128);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8);
  }
  return;
}

Assistant:

Finite(const BigInteger &n): val(n)
    {
        if(val >= _FINITE_ORDER)
            val %= _FINITE_ORDER;
        if(val < 0)
            val = _FINITE_ORDER - ((0ll - val - 1) % _FINITE_ORDER + 1);
    }